

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::df_store(Forth *this)

{
  double local_20;
  double x;
  Forth *pFStack_10;
  AAddr aaddr;
  Forth *this_local;
  
  pFStack_10 = this;
  requireDStackDepth(this,1,"DF!");
  requireFStackDepth(this,1,"DF!");
  x._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  local_20 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  setDataCell64(this,x._4_4_,&local_20);
  return;
}

Assistant:

void df_store() {
			REQUIRE_DSTACK_DEPTH(1, "DF!");
			REQUIRE_FSTACK_DEPTH(1, "DF!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "DF!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell64(aaddr, x);
		}